

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

void linsolve(double *vec,double *mat,int16_t n)

{
  int iVar1;
  short sVar2;
  bool bVar3;
  double dVar4;
  int iVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  ulong uVar9;
  undefined2 in_register_00000012;
  int16_t iVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  long lVar15;
  long lVar16;
  short sVar17;
  long lVar18;
  ulong uVar19;
  short sVar20;
  int iVar21;
  long lVar22;
  short sVar23;
  short sVar24;
  uint uVar25;
  double dVar26;
  
  uVar25 = CONCAT22(in_register_00000012,n) - 1;
  if (1 < n) {
    uVar9 = (ulong)(ushort)n;
    sVar6 = n + 1;
    sVar11 = 1;
    iVar21 = 0;
    sVar20 = 0;
    sVar17 = 1;
    iVar8 = 0;
    sVar2 = sVar6;
    iVar10 = n;
    do {
      lVar18 = (long)sVar17;
      iVar1 = iVar8 + 1;
      sVar12 = (short)iVar1;
      if (sVar12 < n) {
        sVar7 = (short)iVar8;
        lVar15 = (long)sVar7;
        sVar13 = sVar7 * n + sVar7;
        dVar26 = ABS(mat[sVar13]);
        lVar16 = lVar18;
        sVar24 = sVar11;
        do {
          dVar4 = ABS(mat[sVar24]);
          iVar5 = (int)lVar16;
          if (ABS(mat[sVar24]) <= dVar26) {
            dVar4 = dVar26;
            iVar5 = iVar8;
          }
          iVar8 = iVar5;
          dVar26 = dVar4;
          lVar16 = lVar16 + 1;
          sVar24 = sVar24 + 1;
        } while (lVar16 < (long)uVar9);
        sVar24 = (short)iVar8;
        if (sVar24 != sVar7) {
          dVar26 = vec[lVar15];
          vec[lVar15] = vec[sVar24];
          vec[sVar24] = dVar26;
          iVar8 = iVar21 + iVar8;
          lVar16 = lVar15;
          sVar24 = sVar20;
          do {
            dVar26 = mat[sVar24];
            mat[sVar24] = mat[(short)iVar8];
            mat[(short)iVar8] = dVar26;
            lVar16 = lVar16 + 1;
            sVar24 = sVar24 + n;
            iVar8 = iVar8 + CONCAT22(in_register_00000012,n);
          } while (lVar16 < (long)uVar9);
        }
        if (sVar12 < n) {
          dVar26 = mat[sVar13];
          lVar16 = lVar18;
          sVar24 = sVar2;
          do {
            sVar14 = (short)lVar16 + sVar7 * n;
            mat[sVar14] = mat[sVar14] * (1.0 / dVar26);
            lVar22 = lVar18;
            sVar13 = sVar24;
            sVar23 = iVar10;
            do {
              mat[sVar13] = mat[sVar13] - mat[sVar14] * mat[sVar23];
              lVar22 = lVar22 + 1;
              sVar23 = sVar23 + n;
              sVar13 = sVar13 + n;
            } while (lVar22 < (long)uVar9);
            vec[lVar16] = vec[lVar16] - mat[sVar14] * vec[lVar15];
            lVar16 = lVar16 + 1;
            sVar24 = sVar24 + 1;
          } while (lVar16 < (long)uVar9);
        }
      }
      sVar17 = sVar17 + 1;
      sVar11 = sVar11 + sVar6;
      sVar20 = sVar20 + sVar6;
      iVar21 = iVar21 + CONCAT22(in_register_00000012,n);
      iVar10 = iVar10 + sVar6;
      sVar2 = sVar2 + sVar6;
      iVar8 = iVar1;
    } while ((int)sVar12 < (int)uVar25);
  }
  if (-1 < (short)uVar25) {
    sVar11 = (n - 1U & 0x7fff) * (n + 1);
    uVar9 = (ulong)(uVar25 & 0x7fff);
    do {
      dVar26 = vec[uVar9];
      sVar20 = sVar11;
      for (uVar19 = (ulong)(uVar25 & 0x7fff); (long)uVar9 < (long)uVar19; uVar19 = uVar19 - 1) {
        lVar18 = (long)sVar20;
        sVar20 = sVar20 - n;
        dVar26 = dVar26 - mat[lVar18] * vec[uVar19];
        vec[uVar9] = dVar26;
      }
      vec[uVar9] = dVar26 / mat[(short)((n + 1) * (short)uVar9)];
      sVar11 = sVar11 + -1;
      bVar3 = 0 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar3);
  }
  return;
}

Assistant:

inline void linsolve(double* vec, double* mat, const int16_t n) {
  int16_t i, j, k, idx1, idx2, idx3;
  int16_t row_max_i;
  double row_max_val, buf;

  for (k = 0; k < n - 1; k++) {
    // Find i such that maximize A[i][k]
    idx1 = n * k + k;

    row_max_i = k;
    row_max_val = fabs(mat[idx1]);
    for (i = k + 1; i < n; i++) {
      idx1 = n * k + i;
      if (row_max_val < fabs(mat[idx1])) {
        row_max_val = fabs(mat[idx1]);
        row_max_i = i;
      }
    }

    // Swap rows
    if (row_max_i != k) {
      buf = vec[k];
      vec[k] = vec[row_max_i];
      vec[row_max_i] = buf;
      for (j = k; j < n; j++) {
        idx1 = n * j + k;
        idx2 = n * j + row_max_i;
        buf = mat[idx1];
        mat[idx1] = mat[idx2];
        mat[idx2] = buf;
      }
    }

    // Forward elimination
    idx1 = n * k + k;
    buf = 1.0 / mat[idx1];
    for (i = k + 1; i < n; i++) {
      idx1 = n * k + i;
      mat[idx1] = mat[idx1] * buf;

      for (j = k + 1; j < n; j++) {
        idx2 = n * j + k;
        idx3 = n * j + i;
        mat[idx3] -= mat[idx1] * mat[idx2];
      }
      vec[i] -= mat[idx1] * vec[k];
    }
  }

  // Backward elimination
  for (i = n - 1; i >= 0; i--) {
    for (j = n - 1; j > i; j--) {
      idx1 = n * j + i;
      vec[i] -= mat[idx1] * vec[j];
    }
    idx1 = n * i + i;
    vec[i] /= mat[idx1];
  }
}